

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_verifyObjLimitReal
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  Verbosity VVar1;
  bool bVar2;
  bool bVar3;
  type_conflict5 tVar4;
  SPxOut *pSVar5;
  SPxOut *pSVar6;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  redcostviol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  dualviol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumviol;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> local_130;
  Real local_f8;
  Real local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  pSVar6 = &this->spxout;
  VVar1 = (this->spxout).m_verbosity;
  if (2 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO1;
    pSVar5 = soplex::operator<<(pSVar6," --- verifying objective limit");
    std::endl<char,std::char_traits<char>>(pSVar5->m_streams[pSVar5->m_verbosity]);
    (this->spxout).m_verbosity = VVar1;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_68,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_130,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_168,0,(type *)0x0);
  bVar2 = getDualViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_130,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_68);
  bVar3 = getRedCostViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_168,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_68);
  if ((bVar2) && (bVar3)) {
    local_f0 = Tolerances::floatingPointOpttol
                         ((this->_solver).
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ._tolerances.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    tVar4 = boost::multiprecision::operator>=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_130,&local_f0);
    if (!tVar4) {
      local_f8 = Tolerances::floatingPointOpttol
                           ((this->_solver).
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ._tolerances.
                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
      tVar4 = boost::multiprecision::operator>=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_168,&local_f8);
      if (!tVar4) {
        return;
      }
    }
  }
  VVar1 = (this->spxout).m_verbosity;
  if ((int)VVar1 < 5) {
    if ((int)VVar1 < 3) goto LAB_002b0156;
  }
  else {
    (this->spxout).m_verbosity = INFO3;
    pSVar5 = soplex::operator<<(pSVar6,", dual violation: ");
    local_a8.m_backend.data._M_elems[0] = local_130.data._M_elems[0];
    local_a8.m_backend.data._M_elems[1] = local_130.data._M_elems[1];
    local_a8.m_backend.data._M_elems[2] = local_130.data._M_elems[2];
    local_a8.m_backend.data._M_elems[3] = local_130.data._M_elems[3];
    local_a8.m_backend.data._M_elems[4] = local_130.data._M_elems[4];
    local_a8.m_backend.data._M_elems[5] = local_130.data._M_elems[5];
    local_a8.m_backend.data._M_elems[6] = local_130.data._M_elems[6];
    local_a8.m_backend.data._M_elems[7] = local_130.data._M_elems[7];
    local_a8.m_backend.data._M_elems[8] = local_130.data._M_elems[8];
    local_a8.m_backend.data._M_elems[9] = local_130.data._M_elems[9];
    local_a8.m_backend.exp = local_130.exp;
    local_a8.m_backend.neg = local_130.neg;
    local_a8.m_backend.fpclass = local_130.fpclass;
    local_a8.m_backend.prec_elem = local_130.prec_elem;
    pSVar5 = soplex::operator<<(pSVar5,&local_a8);
    pSVar5 = soplex::operator<<(pSVar5,", redcost violation: ");
    local_e8.m_backend.data._M_elems[0] = local_168.data._M_elems[0];
    local_e8.m_backend.data._M_elems[1] = local_168.data._M_elems[1];
    local_e8.m_backend.data._M_elems[2] = local_168.data._M_elems[2];
    local_e8.m_backend.data._M_elems[3] = local_168.data._M_elems[3];
    local_e8.m_backend.data._M_elems[4] = local_168.data._M_elems[4];
    local_e8.m_backend.data._M_elems[5] = local_168.data._M_elems[5];
    local_e8.m_backend.data._M_elems[6] = local_168.data._M_elems[6];
    local_e8.m_backend.data._M_elems[7] = local_168.data._M_elems[7];
    local_e8.m_backend.data._M_elems[8] = local_168.data._M_elems[8];
    local_e8.m_backend.data._M_elems[9] = local_168.data._M_elems[9];
    local_e8.m_backend.exp = local_168.exp;
    local_e8.m_backend.neg = local_168.neg;
    local_e8.m_backend.fpclass = local_168.fpclass;
    local_e8.m_backend.prec_elem = local_168.prec_elem;
    pSVar5 = soplex::operator<<(pSVar5,&local_e8);
    std::endl<char,std::char_traits<char>>(pSVar5->m_streams[pSVar5->m_verbosity]);
  }
  (this->spxout).m_verbosity = INFO1;
  pSVar6 = soplex::operator<<(pSVar6,
                              " --- detected violations in original problem space -- solve again without presolving/scaling"
                             );
  std::endl<char,std::char_traits<char>>(pSVar6->m_streams[pSVar6->m_verbosity]);
  (this->spxout).m_verbosity = VVar1;
LAB_002b0156:
  if (this->_simplifier ==
      (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0 && this->_scaler ==
                (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0) {
    (this->_solver).useTerminationValue = false;
  }
  else if (this->_isRealLPScaled == true) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::unscaleLPandReloadBasis(&this->_solver);
    this->_isRealLPScaled = false;
    this->_unscaleCalls = this->_unscaleCalls + 1;
  }
  _preprocessAndSolveReal(this,false,(bool *)0x0);
  return;
}

Assistant:

void SoPlexBase<R>::_verifyObjLimitReal()
{
   SPX_MSG_INFO1(spxout, spxout << " --- verifying objective limit" << std::endl;)

   R sumviol = 0;
   R dualviol = 0;
   R redcostviol = 0;

   bool dualfeasible = true;

   if(!getDualViolation(dualviol, sumviol))
      dualfeasible = false;

   if(!getRedCostViolation(redcostviol, sumviol))
      dualfeasible = false;

   if(!dualfeasible || dualviol >= _solver.tolerances()->floatingPointOpttol()
         || redcostviol >= _solver.tolerances()->floatingPointOpttol())
   {
      assert(&_solver == _realLP);
      assert(_isRealLPLoaded);
      SPX_MSG_INFO3(spxout, spxout << ", dual violation: " << dualviol
                    << ", redcost violation: " << redcostviol << std::endl;)
      SPX_MSG_INFO1(spxout, spxout <<
                    " --- detected violations in original problem space -- solve again without presolving/scaling" <<
                    std::endl;)

      // if we already disabled simplifier and scaler, next disable the objective limit
      if(_scaler == nullptr && _simplifier == nullptr)
      {
         _solver.toggleTerminationValue(false);
      }
      else if(_isRealLPScaled)
      {
         _solver.unscaleLPandReloadBasis();
         _isRealLPScaled = false;
         ++_unscaleCalls;
      }

      _preprocessAndSolveReal(false);
   }
}